

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

void __thiscall crnlib::sparse_bit_array::clear_all_bits(sparse_bit_array *this)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (this->m_num_groups != 0) {
    uVar2 = 0;
    do {
      puVar1 = this->m_ppGroups[uVar2];
      if (puVar1 != (uint32 *)0x0) {
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        puVar1[0xe] = 0;
        puVar1[0xf] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->m_num_groups);
  }
  return;
}

Assistant:

void sparse_bit_array::clear_all_bits() {
  for (uint i = 0; i < m_num_groups; i++) {
    uint32* pGroup = m_ppGroups[i];
    if (pGroup)
      memset(pGroup, 0, sizeof(uint32) * cDWORDsPerGroup);
  }
}